

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O3

void __thiscall
ReadOnlyStringCallback::ReadOnlyStringCallback
          (ReadOnlyStringCallback *this,SortableOIDType *oid,string *value)

{
  pointer pcVar1;
  
  (this->super_ValueCallback).OID = oid;
  (this->super_ValueCallback).type = STRING;
  (this->super_ValueCallback).isSettable = false;
  (this->super_ValueCallback).setOccurred = false;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_001a1a40;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

ReadOnlyStringCallback(SortableOIDType* oid, const std::string &value): ValueCallback(oid, STRING), value(value) {}